

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# components.hpp
# Opt level: O2

holder<cs::range_type> * __thiscall
cs::allocator_type<cs_impl::any::holder<cs::range_type>,64ul,cs_impl::default_allocator_provider>::
alloc<cs::range_type&>
          (allocator_type<cs_impl::any::holder<cs::range_type>,64ul,cs_impl::default_allocator_provider>
           *this,range_type *args)

{
  long lVar1;
  holder<cs::range_type> *this_00;
  
  if ((*(long *)(this + 0x208) == 0) || (global_thread_counter != 0)) {
    this_00 = (holder<cs::range_type> *)operator_new(0x70);
  }
  else {
    lVar1 = *(long *)(this + 0x208);
    *(long *)(this + 0x208) = lVar1 + -1;
    this_00 = *(holder<cs::range_type> **)(this + lVar1 * 8 + -8);
  }
  cs_impl::any::holder<cs::range_type>::holder<cs::range_type&>(this_00,args);
  return this_00;
}

Assistant:

inline T *alloc(ArgsT &&...args)
		{
			T *ptr = nullptr;
			if (mOffset > 0 && global_thread_counter == 0)
				ptr = mPool[--mOffset];
			else
				ptr = mAlloc.allocate(1);
			mAlloc.construct(ptr, std::forward<ArgsT>(args)...);
			return ptr;
		}